

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O3

int ztransform(uint8_t *msg,uint32_t *h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [16];
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint32_t uVar20;
  uint uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint auStack_174 [8];
  int local_154 [7];
  uint local_138 [66];
  
  lVar14 = 0;
  do {
    auVar13._1_4_ = (uint)msg[lVar14 * 4 + 4] << 0x18;
    auVar13[0] = msg[lVar14 * 4];
    auVar13._5_4_ = (uint)msg[lVar14 * 4 + 8] << 0x18;
    auVar13._9_4_ = (uint)msg[lVar14 * 4 + 0xc] << 0x18;
    auVar13._13_3_ = 0;
    auVar1[1] = 0;
    auVar1[0] = msg[lVar14 * 4 + 5];
    auVar8._12_2_ = 0;
    auVar8._0_12_ = SUB1612((undefined1  [16])0x0,0);
    auVar8[0xe] = msg[lVar14 * 4 + 0xd];
    auVar9[10] = msg[lVar14 * 4 + 9];
    auVar9._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar9[0xb] = 0;
    auVar9._12_3_ = auVar8._12_3_;
    auVar10._10_5_ = auVar9._10_5_;
    auVar10._0_10_ = (unkuint10)0;
    auVar1._2_7_ = auVar10._8_7_;
    auVar1._9_7_ = 0;
    auVar25._4_12_ = SUB1612(auVar1 << 0x30,4);
    auVar25._0_4_ = (CONCAT11(msg[lVar14 * 4 + 5],msg[lVar14 * 4 + 1]) & 0xff) << 0x10;
    auVar2[0xc] = msg[lVar14 * 4 + 0xe];
    auVar2._0_12_ = ZEXT812(0);
    auVar3._10_3_ = auVar2._10_3_;
    auVar3._0_10_ = (unkuint10)msg[lVar14 * 4 + 10] << 0x40;
    auVar11._5_8_ = 0;
    auVar11._0_5_ = auVar3._8_5_;
    uVar26 = CONCAT13(0,CONCAT12(msg[lVar14 * 4 + 6],(ushort)msg[lVar14 * 4 + 2]));
    auVar4[4] = msg[lVar14 * 4 + 6];
    auVar4._0_4_ = uVar26;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar11 << 0x40,6);
    auVar27._0_4_ = (uVar26 & 0xffff) << 8;
    auVar27._4_4_ = auVar4._4_4_ << 8;
    auVar27._8_4_ = auVar3._8_4_ << 8;
    auVar27._12_4_ = (uint)(uint3)(auVar2._10_3_ >> 0x10) << 8;
    auVar5[0xc] = msg[lVar14 * 4 + 0xf];
    auVar5._0_12_ = ZEXT812(0);
    auVar6._10_3_ = auVar5._10_3_;
    auVar6._0_10_ = (unkuint10)msg[lVar14 * 4 + 0xb] << 0x40;
    auVar12._5_8_ = 0;
    auVar12._0_5_ = auVar6._8_5_;
    uVar26 = CONCAT13(0,CONCAT12(msg[lVar14 * 4 + 7],(ushort)msg[lVar14 * 4 + 3]));
    auVar7[4] = msg[lVar14 * 4 + 7];
    auVar7._0_4_ = uVar26;
    auVar7[5] = 0;
    auVar7._6_7_ = SUB137(auVar12 << 0x40,6);
    auVar28._0_4_ = uVar26 & 0xffff;
    auVar28._4_9_ = auVar7._4_9_;
    auVar28._13_3_ = 0;
    *(undefined1 (*) [16])(local_138 + lVar14) = auVar28 | auVar27 | auVar25 | auVar13 << 0x18;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x10);
  lVar14 = 0x10;
  do {
    uVar26 = auStack_174[lVar14];
    uVar21 = local_138[lVar14 + -2];
    local_138[lVar14] =
         (uVar26 >> 3 ^ (uVar26 << 0xe | uVar26 >> 0x12) ^ (uVar26 << 0x19 | uVar26 >> 7)) +
         local_138[0] +
         (uVar21 >> 10 ^ (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11)) +
         local_154[lVar14];
    lVar14 = lVar14 + 1;
    local_138[0] = uVar26;
  } while (lVar14 != 0x40);
  lVar14 = 0;
  uVar23 = *h;
  uVar22 = h[1];
  uVar26 = h[2];
  uVar21 = h[3];
  uVar20 = h[4];
  uVar19 = h[5];
  uVar18 = h[6];
  uVar24 = h[7];
  do {
    uVar16 = uVar18;
    uVar18 = uVar19;
    uVar19 = uVar20;
    uVar15 = uVar26;
    uVar26 = uVar22;
    uVar22 = uVar23;
    iVar17 = ((uVar18 ^ uVar16) & uVar19 ^ uVar16) + uVar24 +
             ((uVar19 << 7 | uVar19 >> 0x19) ^
             (uVar19 << 0x15 | uVar19 >> 0xb) ^ (uVar19 << 0x1a | uVar19 >> 6)) +
             *(int *)((long)k + lVar14) + *(int *)((long)local_138 + lVar14);
    uVar20 = uVar21 + iVar17;
    uVar23 = (uVar26 & uVar15 ^ (uVar26 ^ uVar15) & uVar22) +
             ((uVar22 << 10 | uVar22 >> 0x16) ^
             (uVar22 << 0x13 | uVar22 >> 0xd) ^ (uVar22 << 0x1e | uVar22 >> 2)) + iVar17;
    lVar14 = lVar14 + 4;
    uVar21 = uVar15;
    uVar24 = uVar16;
  } while (lVar14 != 0x100);
  *h = uVar23 + *h;
  h[1] = uVar22 + h[1];
  h[2] = uVar26 + h[2];
  h[3] = uVar15 + h[3];
  h[4] = uVar20 + h[4];
  uVar23 = uVar19 + h[5];
  h[5] = uVar23;
  h[6] = uVar18 + h[6];
  h[7] = uVar16 + h[7];
  return uVar23;
}

Assistant:

static int ztransform(const uint8_t *msg, uint32_t *h)
{
    uint32_t w[64];
    uint32_t a0, b1, c2, d3, e4, f5, g6, h7;
    uint32_t t1, t2;

    int i = 0;
    int j = 0;

    for (i=0; i<16; i++) {
        w[i] = msg[j]<<24 | msg[j+1]<<16 | msg[j+2]<<8 | msg[j+3];
        j += 4;
    }

    for(i=16; i<64; i++){
        w[i] = SSIG1(w[i-2])+w[i-7]+SSIG0(w[i-15])+w[i-16];
    }

    zdump_hex((uint8_t*)w, 64*4);

    a0 = h[0];
    b1 = h[1];
    c2 = h[2];
    d3 = h[3];
    e4 = h[4];
    f5 = h[5];
    g6 = h[6];
    h7 = h[7];

    for (i= 0; i<64; i++) {
        t1 = h7 + BSIG1(e4) + CHX(e4, f5, g6) + k[i] + w[i];
        t2 = BSIG0(a0) + MAJ(a0, b1, c2);

        h7 = g6;
        g6 = f5;
        f5 = e4;
        e4 = d3 + t1;
        d3 = c2;
        c2 = b1;
        b1 = a0;
        a0 = t1 + t2;
    }

    h[0] += a0;
    h[1] += b1;
    h[2] += c2;
    h[3] += d3;
    h[4] += e4;
    h[5] += f5;
    h[6] += g6;
    h[7] += h7;

    return 0;
}